

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O3

QVariant *
QAbstractSpinBoxPrivate::variantBound
          (QVariant *__return_storage_ptr__,QVariant *min,QVariant *value,QVariant *max)

{
  int iVar1;
  
  iVar1 = variantCompare(min,value);
  if ((iVar1 < 0) && (iVar1 = variantCompare(value,max), min = max, iVar1 < 0)) {
    min = value;
  }
  ::QVariant::QVariant(__return_storage_ptr__,min);
  return __return_storage_ptr__;
}

Assistant:

QVariant QAbstractSpinBoxPrivate::variantBound(const QVariant &min,
                                               const QVariant &value,
                                               const QVariant &max)
{
    Q_ASSERT(variantCompare(min, max) <= 0);
    if (variantCompare(min, value) < 0) {
        const int compMax = variantCompare(value, max);
        return (compMax < 0 ? value : max);
    } else {
        return min;
    }
}